

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::supervised
          (FastText *this,Model *model,real lr,vector<int,_std::allocator<int>_> *line,
          vector<int,_std::allocator<int>_> *labels,int32_t id)

{
  size_type sVar1;
  element_type *peVar2;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int32_t in_XMM0_Da;
  Model *unaff_retaddr;
  int32_t i;
  uniform_int_distribution<int> uniform;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int32_t id_00;
  real in_stack_ffffffffffffffe8;
  vector<int,_std::allocator<int>_> *input;
  
  input = in_RDI;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  if (sVar1 != 0) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
    id_00 = (int32_t)((ulong)in_RDX >> 0x20);
    if (sVar1 != 0) {
      peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x16388c);
      if (peVar2->loss == ova) {
        Model::update(unaff_retaddr,input,in_RSI,in_XMM0_Da,in_stack_ffffffffffffffe8,id_00);
      }
      else {
        std::vector<int,_std::allocator<int>_>::size(in_RCX);
        std::uniform_int_distribution<int>::uniform_int_distribution
                  ((uniform_int_distribution<int> *)in_RDI,in_stack_ffffffffffffffbc,
                   in_stack_ffffffffffffffb8);
        std::uniform_int_distribution<int>::operator()
                  ((uniform_int_distribution<int> *)in_RDI,
                   (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        Model::update(unaff_retaddr,input,in_RSI,in_XMM0_Da,in_stack_ffffffffffffffe8,id_00);
      }
    }
  }
  return;
}

Assistant:

void FastText::supervised(
		Model& model,
		real lr,
		const std::vector<int32_t>& line,
		const std::vector<int32_t>& labels,
		int32_t id) {
	if (labels.size() == 0 || line.size() == 0) {
		return;
	}
	if (args_->loss == loss_name::ova) {
		model.update(line, labels, Model::kAllLabelsAsTarget, lr,id);
	} else {
		std::uniform_int_distribution<> uniform(0, labels.size() - 1);
		int32_t i = uniform(model.rng);
		model.update(line, labels, i, lr,id);
	}
}